

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * create_swizzle_abi_cxx11_(string *__return_storage_ptr__,MSLComponentSwizzle swizzle)

{
  string *extraout_RAX;
  CompilerError *this;
  char *pcVar1;
  char *pcVar2;
  
  switch(swizzle) {
  case MSL_COMPONENT_SWIZZLE_IDENTITY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::none";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_ZERO:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::zero";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_ONE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::one";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_R:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::red";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_G:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::green";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_B:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::blue";
    pcVar1 = "";
    break;
  case MSL_COMPONENT_SWIZZLE_A:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "spvSwizzle::alpha";
    pcVar1 = "";
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid component swizzle.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return extraout_RAX;
}

Assistant:

static string create_swizzle(MSLComponentSwizzle swizzle)
{
	switch (swizzle)
	{
	case MSL_COMPONENT_SWIZZLE_IDENTITY:
		return "spvSwizzle::none";
	case MSL_COMPONENT_SWIZZLE_ZERO:
		return "spvSwizzle::zero";
	case MSL_COMPONENT_SWIZZLE_ONE:
		return "spvSwizzle::one";
	case MSL_COMPONENT_SWIZZLE_R:
		return "spvSwizzle::red";
	case MSL_COMPONENT_SWIZZLE_G:
		return "spvSwizzle::green";
	case MSL_COMPONENT_SWIZZLE_B:
		return "spvSwizzle::blue";
	case MSL_COMPONENT_SWIZZLE_A:
		return "spvSwizzle::alpha";
	default:
		SPIRV_CROSS_THROW("Invalid component swizzle.");
	}
}